

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

Vector<int,_std::allocator<int>_> * __thiscall
amrex::AmrLevel::getBCArray
          (Vector<int,_std::allocator<int>_> *__return_storage_ptr__,AmrLevel *this,int State_Type,
          int gridno,int strt_comp,int ncomp)

{
  pointer piVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  BCRec local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,(long)(ncomp * 6),
             (allocator_type *)&local_48);
  local_48.bc[0] = -0x29a;
  local_48.bc[1] = -0x29a;
  local_48.bc[2] = -0x29a;
  local_48.bc[3] = -0x29a;
  local_48.bc[4] = -0x29a;
  local_48.bc[5] = -0x29a;
  uVar5 = 0;
  uVar3 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar3 = uVar5;
  }
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    StateData::getBC(&local_48,
                     (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                     .super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     _M_impl.super__Vector_impl_data._M_start + State_Type,strt_comp + (int)uVar4,
                     gridno);
    piVar1 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      *(int *)((long)piVar1 + lVar2 * 4 + uVar5) = local_48.bc[lVar2];
    }
    uVar5 = uVar5 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<int>
AmrLevel::getBCArray (int State_Type,
                      int gridno,
                      int strt_comp,
                      int ncomp)
{
    Vector<int> bc(2*AMREX_SPACEDIM*ncomp);

    BCRec bcr;

    for (int n = 0; n < ncomp; n++)
    {
        bcr = state[State_Type].getBC(strt_comp+n,gridno);
        const int* b_rec = bcr.vect();
        for (int m = 0; m < 2*AMREX_SPACEDIM; m++)
            bc[2*AMREX_SPACEDIM*n + m] = b_rec[m];
    }

    return bc;
}